

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

void __thiscall soul::Value::PackedData::negateAs<std::complex<float>>(PackedData *this)

{
  if (this->size == 8) {
    *(ulong *)this->data = *(ulong *)this->data ^ 0x8000000080000000;
    return;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
}

Assistant:

Primitive getAs() const                 { SOUL_ASSERT (size == sizeof (Primitive)); return readUnaligned<Primitive> (data); }